

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2vd_parser.c
# Opt level: O1

MPP_RET m2vd_parser_flush(void *ctx)

{
  RK_S32 index;
  long lVar1;
  
  lVar1 = *ctx;
  if (((byte)m2vd_debug & 1) != 0) {
    _mpp_log_l(4,"m2vd_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_I",0x16d,
               "m2vd_parser_flush");
  }
  index = *(RK_S32 *)(*(long *)(lVar1 + 0x298) + 0x3c);
  if ((-1 < index) && (*(int *)(*(long *)(lVar1 + 0x298) + 0x38) != 0)) {
    mpp_buf_slot_set_flag(*(MppBufSlots *)(lVar1 + 0x2d8),index,SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue
              (*(MppBufSlots *)(lVar1 + 0x2d8),*(RK_S32 *)(*(long *)(lVar1 + 0x298) + 0x3c),
               QUEUE_DISPLAY);
    *(undefined4 *)(*(long *)(lVar1 + 0x298) + 0x38) = 0;
  }
  if (((byte)m2vd_debug & 1) != 0) {
    _mpp_log_l(4,"m2vd_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_O",0x177,
               "m2vd_parser_flush");
  }
  return MPP_OK;
}

Assistant:

MPP_RET m2vd_parser_flush(void *ctx)
{
    MPP_RET ret = MPP_OK;
    M2VDContext *c = (M2VDContext *)ctx;
    M2VDParserContext *p = (M2VDParserContext *)c->parse_ctx;
    m2vd_dbg_func("FUN_I");

    if ((p->frame_ref0->slot_index >= 0) && p->frame_ref0->flags) {
        mpp_buf_slot_set_flag(p->frame_slots, p->frame_ref0->slot_index,
                              SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(p->frame_slots, p->frame_ref0->slot_index,
                             QUEUE_DISPLAY);
        p->frame_ref0->flags = 0;
    }

    m2vd_dbg_func("FUN_O");
    return ret;
}